

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

void gdImageVLine(gdImagePtr im,int x,int y1,int y2,int col)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = im->thick;
  if (1 < (int)uVar1) {
    gdImageFilledRectangle(im,x - (uVar1 >> 1),y1,~(uVar1 >> 1) + uVar1 + x,y2,col);
    return;
  }
  iVar2 = y1;
  if (y1 < y2) {
    iVar2 = y2;
  }
  if (y2 < y1) {
    y1 = y2;
  }
  do {
    gdImageSetPixel(im,x,y1,col);
    y1 = y1 + 1;
  } while (iVar2 + 1 != y1);
  return;
}

Assistant:

static void gdImageVLine(gdImagePtr im, int x, int y1, int y2, int col)
{
	if (im->thick > 1) {
		int thickhalf = im->thick >> 1;
		gdImageFilledRectangle(im, x - thickhalf, y1, x + im->thick - thickhalf - 1, y2, col);
	} else {
		if (y2 < y1) {
			int t = y1;
			y1 = y2;
			y2 = t;
		}

		for (; y1 <= y2; y1++) {
			gdImageSetPixel(im, x, y1, col);
		}
	}
	return;
}